

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_files.h
# Opt level: O0

int cf_dir_open(cf_dir_t *dir,char *path)

{
  DIR *pDVar1;
  int *piVar2;
  char *pcVar3;
  dirent *pdVar4;
  char *path_local;
  cf_dir_t *dir_local;
  
  cf_safe_strcpy_internal
            (dir->path,path,0,0x400,
             "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
             ,0x1a4);
  pDVar1 = opendir(path);
  dir->dir = (DIR *)pDVar1;
  if (dir->dir == (DIR *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    printf("ERROR: Failed to open directory (%s): %s.\n",path,pcVar3);
    cf_dir_close(dir);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
                  ,0x1ab,"int cf_dir_open(cf_dir_t *, const char *)");
  }
  dir->has_next = 1;
  pdVar4 = readdir((DIR *)dir->dir);
  dir->entry = (dirent *)pdVar4;
  if (dir->dir == (DIR *)0x0) {
    dir->has_next = 0;
  }
  return 1;
}

Assistant:

int cf_dir_open(cf_dir_t* dir, const char* path)
	{
		cf_safe_strcpy(dir->path, path, 0, CUTE_FILES_MAX_PATH);
		dir->dir = opendir(path);

		if (!dir->dir)
		{
			printf("ERROR: Failed to open directory (%s): %s.\n", path, strerror(errno));
			cf_dir_close(dir);
			CUTE_FILES_ASSERT(0);
			return 0;
		}

		dir->has_next = 1;
		dir->entry = readdir(dir->dir);
		if (!dir->dir) dir->has_next = 0;

		return 1;
	}